

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test7::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  _variable_type type;
  _variable_type _Var1;
  pointer p_Var2;
  int iVar3;
  string *psVar4;
  uint uVar5;
  long lVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  _variable_type type_00;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  string variable_type_string;
  stringstream result_sstream;
  uchar local_239;
  _variables *local_238;
  uint local_22c;
  string local_228;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  GPUShaderFP64Test7 *local_1e8;
  ulong local_1e0;
  string *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  long local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_238 = variables;
  local_1e8 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 400\n\n",0xe);
  if (local_1e8->m_are_double_inputs_supported == true) {
    pcVar9 = "#extension GL_ARB_vertex_attrib_64bit : require\n";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_ARB_vertex_attrib_64bit : require\n",0x30);
    getVariableDeclarations_abi_cxx11_
              (&local_228,(GPUShaderFP64Test7 *)pcVar9,"in_vs",local_238,"in");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar9 = "out VS_DATA\n{\n";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out VS_DATA\n{\n",0xe);
  getVariableDeclarations_abi_cxx11_
            (&local_228,(GPUShaderFP64Test7 *)pcVar9,"vs",local_238,
             ::glcts::fixed_sample_locations_values + 1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"};\n\nvoid main()\n{\n",0x12);
  lVar6 = (long)(local_238->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_238->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_1d8 = __return_storage_ptr__;
  if (lVar6 != 0) {
    local_1d0 = (lVar6 >> 2) * -0x5555555555555555;
    uVar8 = 0;
    uVar11 = 1;
    do {
      p_Var2 = (local_238->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1c0 = uVar8 * 3;
      uVar10 = (ulong)p_Var2[uVar8].array_size;
      type = p_Var2[uVar8].type;
      uVar5 = Utils::getNumberOfComponentsForVariableType(type);
      local_1f8 = CONCAT44(extraout_var,uVar5);
      Utils::getVariableTypeString_abi_cxx11_(&local_228,(Utils *)(ulong)type,type_00);
      if (uVar10 != 0) {
        iVar3 = (int)local_1f8;
        uVar12 = local_1f8 & 0xffffffff;
        local_208 = 0;
        local_200 = uVar8;
        local_1f0 = uVar10;
        local_1c8 = uVar12;
        do {
          local_22c = (uint)uVar11;
          if ((int)local_1f0 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"vs_variable",0xb);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"vs_variable",0xb);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
          local_1e0 = (ulong)local_22c;
          uVar8 = 0;
          do {
            std::ostream::_M_insert<double>((double)(uint)((int)local_1e0 + (int)uVar8));
            if (local_1e8->m_are_double_inputs_supported == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," + in_vs_variable",0x11);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              if ((int)local_1f0 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
              }
              _Var1 = (&((local_238->
                         super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                         )._M_impl.super__Vector_impl_data._M_start)->type)[local_1c0];
              if ((_Var1 < VARIABLE_TYPE_UINT) &&
                 ((0x7fc03fe0U >> (_Var1 & VARIABLE_TYPE_UINT) & 1) != 0)) {
                uVar5 = Utils::getNumberOfColumnsForVariableType(type);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].",2);
                local_239 = Utils::getComponentAtIndex((uint)((uVar8 & 0xffffffff) / (ulong)uVar5));
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_239,1);
                uVar12 = local_1c8;
              }
              else if (1 < (uint)local_1f8) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
              }
            }
            if (iVar3 - 1 != uVar8) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            }
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
          uVar11 = local_1e0 + uVar8;
          local_208 = local_208 + 1;
        } while (local_208 != local_1f0);
        uVar11 = (ulong)(local_22c + (int)uVar8);
        uVar8 = local_200;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < local_1d0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"gl_Position = vec4(0, 0, 0, 1);\n}\n",0x22);
  psVar4 = local_1d8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar4;
}

Assistant:

std::string GPUShaderFP64Test7::getVertexShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n";

	/* Define input variables if GL_ARB_vertex_attrib_64bit is supported */
	if (m_are_double_inputs_supported)
	{
		result_sstream << "#extension GL_ARB_vertex_attrib_64bit : require\n"
					   << getVariableDeclarations("in_vs", variables, "in");
	}

	/* Define output variables */
	result_sstream << "out VS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("vs", variables);

	/* Define main() */
	result_sstream << "};\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	/* Set output variable values */
	unsigned int counter	 = 1;
	const size_t n_variables = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		const unsigned int	n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			if (variable_array_size == 1)
			{
				result_sstream << "vs_variable" << n_variable << " = " << variable_type_string << "(";
			}
			else
			{
				result_sstream << "vs_variable" << n_variable << "[" << index << "]"
							   << " = " << variable_type_string << "(";
			}

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << (double)(counter++);

				/* Use input attributes, if available */
				if (m_are_double_inputs_supported)
				{
					result_sstream << " + in_vs_variable" << n_variable;

					if (variable_array_size > 1)
					{
						result_sstream << "[" << index << "]";
					}

					if (Utils::isMatrixVariableType(variables[n_variable].type))
					{
						const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
						const unsigned int column	= n_component % n_columns;
						const unsigned int row		 = n_component / n_columns;

						result_sstream << "[" << (column) << "]"
															 "."
									   << Utils::getComponentAtIndex(row);
					}
					else if (n_variable_type_components > 1)
					{
						result_sstream << "[" << n_component << "]";
					}
				}

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			} /* for (all components) */

			result_sstream << ");\n";
		}
	} /* for (all variable types) */

	/* We will be using geometry shader to lay out the actual vertices so
	 * the only thing we need to make sure is that the vertex never gets
	 * culled.
	 */
	result_sstream << "gl_Position = vec4(0, 0, 0, 1);\n"
					  "}\n";

	/* That's it */
	return result_sstream.str();
}